

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh8_factory.cpp
# Opt level: O2

Intersectors * __thiscall
embree::BVH8Factory::BVH8GridIntersectors
          (Intersectors *__return_storage_ptr__,BVH8Factory *this,BVH8 *bvh,
          IntersectVariant ivariant)

{
  Intersector16 local_48;
  
  (__return_storage_ptr__->collider).name = (char *)0x0;
  (__return_storage_ptr__->intersector1).intersect = (IntersectFunc)0x0;
  __return_storage_ptr__->leafIntersector = (void *)0x0;
  (__return_storage_ptr__->collider).collide = (CollideFunc)0x0;
  (__return_storage_ptr__->intersector1).occluded = (OccludedFunc)0x0;
  memset(&(__return_storage_ptr__->intersector1).name,0,0xe0);
  __return_storage_ptr__->ptr = &bvh->super_AccelData;
  if (ivariant == FAST) {
    (*this->BVH8GridIntersector1Moeller)(&__return_storage_ptr__->intersector1);
    (*this->BVH8GridIntersector4HybridMoeller)((Intersector4 *)&local_48);
    (__return_storage_ptr__->intersector4).name = local_48.name;
    *(undefined4 *)&(__return_storage_ptr__->intersector4).intersect = local_48.intersect._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->intersector4).intersect + 4) =
         local_48.intersect._4_4_;
    *(undefined4 *)&(__return_storage_ptr__->intersector4).occluded = local_48.occluded._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->intersector4).occluded + 4) =
         local_48.occluded._4_4_;
    (*this->BVH8GridIntersector8HybridMoeller)((Intersector8 *)&local_48);
    (__return_storage_ptr__->intersector8).name = local_48.name;
    *(undefined4 *)&(__return_storage_ptr__->intersector8).intersect = local_48.intersect._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->intersector8).intersect + 4) =
         local_48.intersect._4_4_;
    *(undefined4 *)&(__return_storage_ptr__->intersector8).occluded = local_48.occluded._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->intersector8).occluded + 4) =
         local_48.occluded._4_4_;
    (*this->BVH8GridIntersector16HybridMoeller)(&local_48);
  }
  else {
    (*this->BVH8GridIntersector1Pluecker)(&__return_storage_ptr__->intersector1);
    (*this->BVH8GridIntersector4HybridPluecker)((Intersector4 *)&local_48);
    (__return_storage_ptr__->intersector4).name = local_48.name;
    *(undefined4 *)&(__return_storage_ptr__->intersector4).intersect = local_48.intersect._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->intersector4).intersect + 4) =
         local_48.intersect._4_4_;
    *(undefined4 *)&(__return_storage_ptr__->intersector4).occluded = local_48.occluded._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->intersector4).occluded + 4) =
         local_48.occluded._4_4_;
    (*this->BVH8GridIntersector8HybridPluecker)((Intersector8 *)&local_48);
    (__return_storage_ptr__->intersector8).name = local_48.name;
    *(undefined4 *)&(__return_storage_ptr__->intersector8).intersect = local_48.intersect._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->intersector8).intersect + 4) =
         local_48.intersect._4_4_;
    *(undefined4 *)&(__return_storage_ptr__->intersector8).occluded = local_48.occluded._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->intersector8).occluded + 4) =
         local_48.occluded._4_4_;
    (*this->BVH8GridIntersector16HybridPluecker)(&local_48);
  }
  (__return_storage_ptr__->intersector16).name = local_48.name;
  (__return_storage_ptr__->intersector16).intersect =
       (IntersectFunc16)CONCAT44(local_48.intersect._4_4_,local_48.intersect._0_4_);
  (__return_storage_ptr__->intersector16).occluded =
       (OccludedFunc16)CONCAT44(local_48.occluded._4_4_,local_48.occluded._0_4_);
  return __return_storage_ptr__;
}

Assistant:

Accel::Intersectors BVH8Factory::BVH8GridIntersectors(BVH8* bvh, IntersectVariant ivariant)
  {
    Accel::Intersectors intersectors;
    intersectors.ptr = bvh;
    if (ivariant == IntersectVariant::FAST)
    {
      intersectors.intersector1  = BVH8GridIntersector1Moeller();
#if defined (EMBREE_RAY_PACKETS)
      intersectors.intersector4  = BVH8GridIntersector4HybridMoeller();
      intersectors.intersector8  = BVH8GridIntersector8HybridMoeller();
      intersectors.intersector16 = BVH8GridIntersector16HybridMoeller();
#endif
    }
    else /* if (ivariant == IntersectVariant::ROBUST) */
    {
      intersectors.intersector1  = BVH8GridIntersector1Pluecker();
#if defined (EMBREE_RAY_PACKETS)
      intersectors.intersector4  = BVH8GridIntersector4HybridPluecker();
      intersectors.intersector8  = BVH8GridIntersector8HybridPluecker();
      intersectors.intersector16 = BVH8GridIntersector16HybridPluecker();
#endif            
    }
    return intersectors;
  }